

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Expr * __thiscall kratos::Generator::expr(Generator *this,ExprOp op,Var *left,Var *right)

{
  element_type *peVar1;
  undefined1 local_38 [8];
  shared_ptr<kratos::Expr> expr;
  Var *right_local;
  Var *left_local;
  ExprOp op_local;
  Generator *this_local;
  
  expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)right;
  right_local = left;
  left_local = (Var *)op;
  op_local = (ExprOp)this;
  std::make_shared<kratos::Expr,kratos::ExprOp&,kratos::Var*&,kratos::Var*&>
            ((ExprOp *)local_38,&left_local,&right_local);
  std::
  unordered_set<std::shared_ptr<kratos::Expr>,std::hash<std::shared_ptr<kratos::Expr>>,std::equal_to<std::shared_ptr<kratos::Expr>>,std::allocator<std::shared_ptr<kratos::Expr>>>
  ::emplace<std::shared_ptr<kratos::Expr>&>
            ((unordered_set<std::shared_ptr<kratos::Expr>,std::hash<std::shared_ptr<kratos::Expr>>,std::equal_to<std::shared_ptr<kratos::Expr>>,std::allocator<std::shared_ptr<kratos::Expr>>>
              *)&this->exprs_,(shared_ptr<kratos::Expr> *)local_38);
  peVar1 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_38);
  std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_38);
  return peVar1;
}

Assistant:

Expr &Generator::expr(ExprOp op, Var *left, Var *right) {
    auto expr = std::make_shared<Expr>(op, left, right);
    exprs_.emplace(expr);
    return *expr;
}